

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

char * CTcParser::read_len_prefix_str
                 (CVmFile *fp,char *tmp_buf,size_t tmp_buf_len,size_t *ret_len,int err_if_too_long)

{
  uint uVar1;
  char *buf;
  char *buflen;
  undefined8 *in_RCX;
  char *in_RDX;
  long in_RSI;
  uint in_R8D;
  size_t alloc_len;
  size_t read_len;
  CVmFile *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  char *local_8;
  
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffc0);
  buf = (char *)(ulong)uVar1;
  buflen = buf + (int)(uint)(in_RCX == (undefined8 *)0x0);
  if (in_RDX < buflen) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,(int)(ulong)in_R8D);
    local_8 = (char *)0x0;
  }
  else {
    CVmFile::read_bytes((CVmFile *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),buf,(size_t)buflen);
    if (in_RCX == (undefined8 *)0x0) {
      buf[in_RSI] = '\0';
    }
    else {
      *in_RCX = buf;
    }
    local_8 = CTcTokenizer::store_source
                        ((CTcTokenizer *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),buf,
                         (size_t)buflen);
  }
  return local_8;
}

Assistant:

const char *CTcParser::read_len_prefix_str
   (CVmFile *fp, char *tmp_buf, size_t tmp_buf_len, size_t *ret_len,
    int err_if_too_long)
{
    size_t read_len;
    size_t alloc_len;
    
    /* read the length to read from the file */
    read_len = (size_t)fp->read_uint2();

    /* if we need null termination, add a byte to the allocation length */
    alloc_len = read_len + (ret_len == 0 ? 1 : 0);

    /* if it won't fit in the temporary buffer, it's an error */
    if (alloc_len > tmp_buf_len)
    {
        /* log the error and return failure */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, err_if_too_long);
        return 0;
    }

    /* read the bytes into the temporary buffer */
    fp->read_bytes(tmp_buf, read_len);

    /* add null termination if required, or set the return length if not */
    if (ret_len == 0)
        tmp_buf[read_len] = '\0';
    else
        *ret_len = read_len;

    /* store the result in the tokenizer's text list and return the result */
    return G_tok->store_source(tmp_buf, alloc_len);
}